

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

void fasttext::utils::initSigmoid(void)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [16];
  float fVar4;
  
  if (t_sigmoid == (float *)0x0) {
    pfVar1 = (float *)operator_new__(0x804);
    lVar2 = 0;
    t_sigmoid = pfVar1;
    do {
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar3 = vxorps_avx512vl(ZEXT416((uint)((float)(int)lVar2 * 0.001953125 + -8.0)),auVar3);
      fVar4 = expf(auVar3._0_4_);
      *pfVar1 = 1.0 / (fVar4 + 1.0);
      lVar2 = lVar2 + 0x10;
      pfVar1 = pfVar1 + 1;
    } while (lVar2 != 0x2010);
  }
  return;
}

Assistant:

void initSigmoid() {
    if (t_sigmoid != nullptr) return;
    t_sigmoid = new real[SIGMOID_TABLE_SIZE + 1];
    for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
      real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
      t_sigmoid[i] = 1.0 / (1.0 + std::exp(-x));
    }
  }